

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_8x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 *puVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  short sVar11;
  ushort uVar12;
  ushort uVar13;
  short sVar14;
  ushort uVar15;
  ushort uVar16;
  short sVar17;
  ushort uVar18;
  ushort uVar19;
  short sVar20;
  ushort uVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  ushort uVar28;
  short sVar29;
  undefined1 auVar10 [16];
  ushort uVar30;
  ushort uVar31;
  __m128i top_right;
  int val;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  __m128i weighted_px_1;
  __m128i weighted_px_2;
  __m128i weighted_px_3;
  undefined1 local_768;
  undefined1 uStack_767;
  undefined1 uStack_766;
  undefined1 uStack_765;
  undefined2 uStack_706;
  undefined2 uStack_704;
  undefined2 uStack_702;
  undefined2 uStack_6fe;
  undefined2 uStack_6fc;
  undefined2 uStack_6fa;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  __m128i left_y;
  __m128i y_select;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i left;
  
  bVar1 = *(byte *)(in_RDX + 7);
  uVar9 = (ushort)bVar1;
  uVar2 = *in_RCX;
  local_768 = (byte)uVar2;
  uStack_767 = (undefined1)((uint)uVar2 >> 8);
  uStack_766 = (undefined1)((uint)uVar2 >> 0x10);
  uStack_765 = (undefined1)((uint)uVar2 >> 0x18);
  uStack_706 = (ushort)bVar1;
  uStack_704 = (ushort)bVar1;
  uStack_702 = (ushort)bVar1;
  uStack_6fe = (ushort)bVar1;
  uStack_6fc = (ushort)bVar1;
  uStack_6fa = (ushort)bVar1;
  sVar11 = uStack_706 * 0x3b;
  sVar14 = uStack_704 * 0x6e;
  sVar17 = uStack_702 * 0x97;
  sVar20 = uVar9 * 0xb7;
  sVar23 = uStack_6fe * 0xce;
  sVar26 = uStack_6fc * 0xdb;
  sVar29 = uStack_6fa * 0xe0;
  auVar5._8_8_ = 0x100010001000100;
  auVar5._0_8_ = 0x100010001000100;
  auVar10 = pshufb(ZEXT716(CONCAT16(uStack_765,
                                    (uint6)CONCAT14(uStack_766,
                                                    (uint)CONCAT12(uStack_767,(ushort)local_768)))),
                   auVar5);
  local_218 = auVar10._0_2_;
  uStack_216 = auVar10._2_2_;
  uStack_214 = auVar10._4_2_;
  uStack_212 = auVar10._6_2_;
  uStack_210 = auVar10._8_2_;
  uStack_20e = auVar10._10_2_;
  uStack_20c = auVar10._12_2_;
  uStack_20a = auVar10._14_2_;
  uVar7 = uVar9 + local_218 * 0xff + 0x80;
  uVar12 = sVar11 + uStack_216 * 0xc5 + 0x80;
  uVar15 = sVar14 + uStack_214 * 0x92 + 0x80;
  uVar18 = sVar17 + uStack_212 * 0x69 + 0x80;
  uVar21 = sVar20 + uStack_210 * 0x49 + 0x80;
  uVar24 = sVar23 + uStack_20e * 0x32 + 0x80;
  uVar27 = sVar26 + uStack_20c * 0x25 + 0x80;
  uVar30 = sVar29 + uStack_20a * 0x20 + 0x80;
  uVar8 = uVar7 >> 8;
  uVar13 = uVar12 >> 8;
  uVar16 = uVar15 >> 8;
  uVar19 = uVar18 >> 8;
  uVar22 = uVar21 >> 8;
  uVar25 = uVar24 >> 8;
  uVar28 = uVar27 >> 8;
  uVar31 = uVar30 >> 8;
  *in_RDI = CONCAT17((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31),
                     CONCAT16((uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) -
                              (0xff < uVar28),
                              CONCAT15((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                       (0xff < uVar25),
                                       CONCAT14((uVar22 != 0) * (uVar22 < 0x100) *
                                                (char)(uVar21 >> 8) - (0xff < uVar22),
                                                CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                         (char)(uVar18 >> 8) - (0xff < uVar19),
                                                         CONCAT12((uVar16 != 0) * (uVar16 < 0x100) *
                                                                  (char)(uVar15 >> 8) -
                                                                  (0xff < uVar16),
                                                                  CONCAT11((uVar13 != 0) *
                                                                           (uVar13 < 0x100) *
                                                                           (char)(uVar12 >> 8) -
                                                                           (0xff < uVar13),
                                                                           (uVar8 != 0) *
                                                                           (uVar8 < 0x100) *
                                                                           (char)(uVar7 >> 8) -
                                                                           (0xff < uVar8))))))));
  auVar4._8_8_ = 0x302030203020302;
  auVar4._0_8_ = 0x302030203020302;
  auVar10 = pshufb(ZEXT716(CONCAT16(uStack_765,
                                    (uint6)CONCAT14(uStack_766,
                                                    (uint)CONCAT12(uStack_767,(ushort)local_768)))),
                   auVar4);
  local_198 = auVar10._0_2_;
  uStack_196 = auVar10._2_2_;
  uStack_194 = auVar10._4_2_;
  uStack_192 = auVar10._6_2_;
  uStack_190 = auVar10._8_2_;
  uStack_18e = auVar10._10_2_;
  uStack_18c = auVar10._12_2_;
  uStack_18a = auVar10._14_2_;
  uVar7 = uVar9 + local_198 * 0xff + 0x80;
  uVar12 = sVar11 + uStack_196 * 0xc5 + 0x80;
  uVar15 = sVar14 + uStack_194 * 0x92 + 0x80;
  uVar18 = sVar17 + uStack_192 * 0x69 + 0x80;
  uVar21 = sVar20 + uStack_190 * 0x49 + 0x80;
  uVar24 = sVar23 + uStack_18e * 0x32 + 0x80;
  uVar27 = sVar26 + uStack_18c * 0x25 + 0x80;
  uVar30 = sVar29 + uStack_18a * 0x20 + 0x80;
  uVar8 = uVar7 >> 8;
  uVar13 = uVar12 >> 8;
  uVar16 = uVar15 >> 8;
  uVar19 = uVar18 >> 8;
  uVar22 = uVar21 >> 8;
  uVar25 = uVar24 >> 8;
  uVar28 = uVar27 >> 8;
  uVar31 = uVar30 >> 8;
  *(undefined8 *)((long)in_RDI + in_RSI) =
       CONCAT17((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31),
                CONCAT16((uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28),
                         CONCAT15((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                  (0xff < uVar25),
                                  CONCAT14((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) -
                                           (0xff < uVar22),
                                           CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                    (char)(uVar18 >> 8) - (0xff < uVar19),
                                                    CONCAT12((uVar16 != 0) * (uVar16 < 0x100) *
                                                             (char)(uVar15 >> 8) - (0xff < uVar16),
                                                             CONCAT11((uVar13 != 0) *
                                                                      (uVar13 < 0x100) *
                                                                      (char)(uVar12 >> 8) -
                                                                      (0xff < uVar13),
                                                                      (uVar8 != 0) * (uVar8 < 0x100)
                                                                      * (char)(uVar7 >> 8) -
                                                                      (0xff < uVar8))))))));
  puVar6 = (undefined8 *)((long)in_RDI + in_RSI + in_RSI);
  auVar3._8_8_ = 0x504050405040504;
  auVar3._0_8_ = 0x504050405040504;
  auVar10 = pshufb(ZEXT716(CONCAT16(uStack_765,
                                    (uint6)CONCAT14(uStack_766,
                                                    (uint)CONCAT12(uStack_767,(ushort)local_768)))),
                   auVar3);
  local_118 = auVar10._0_2_;
  uStack_116 = auVar10._2_2_;
  uStack_114 = auVar10._4_2_;
  uStack_112 = auVar10._6_2_;
  uStack_110 = auVar10._8_2_;
  uStack_10e = auVar10._10_2_;
  uStack_10c = auVar10._12_2_;
  uStack_10a = auVar10._14_2_;
  uVar7 = uVar9 + local_118 * 0xff + 0x80;
  uVar12 = sVar11 + uStack_116 * 0xc5 + 0x80;
  uVar15 = sVar14 + uStack_114 * 0x92 + 0x80;
  uVar18 = sVar17 + uStack_112 * 0x69 + 0x80;
  uVar21 = sVar20 + uStack_110 * 0x49 + 0x80;
  uVar24 = sVar23 + uStack_10e * 0x32 + 0x80;
  uVar27 = sVar26 + uStack_10c * 0x25 + 0x80;
  uVar30 = sVar29 + uStack_10a * 0x20 + 0x80;
  uVar8 = uVar7 >> 8;
  uVar13 = uVar12 >> 8;
  uVar16 = uVar15 >> 8;
  uVar19 = uVar18 >> 8;
  uVar22 = uVar21 >> 8;
  uVar25 = uVar24 >> 8;
  uVar28 = uVar27 >> 8;
  uVar31 = uVar30 >> 8;
  *puVar6 = CONCAT17((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31),
                     CONCAT16((uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) -
                              (0xff < uVar28),
                              CONCAT15((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                       (0xff < uVar25),
                                       CONCAT14((uVar22 != 0) * (uVar22 < 0x100) *
                                                (char)(uVar21 >> 8) - (0xff < uVar22),
                                                CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                         (char)(uVar18 >> 8) - (0xff < uVar19),
                                                         CONCAT12((uVar16 != 0) * (uVar16 < 0x100) *
                                                                  (char)(uVar15 >> 8) -
                                                                  (0xff < uVar16),
                                                                  CONCAT11((uVar13 != 0) *
                                                                           (uVar13 < 0x100) *
                                                                           (char)(uVar12 >> 8) -
                                                                           (0xff < uVar13),
                                                                           (uVar8 != 0) *
                                                                           (uVar8 < 0x100) *
                                                                           (char)(uVar7 >> 8) -
                                                                           (0xff < uVar8))))))));
  auVar10._8_8_ = 0x706070607060706;
  auVar10._0_8_ = 0x706070607060706;
  auVar10 = pshufb(ZEXT716(CONCAT16(uStack_765,
                                    (uint6)CONCAT14(uStack_766,
                                                    (uint)CONCAT12(uStack_767,(ushort)local_768)))),
                   auVar10);
  local_98 = auVar10._0_2_;
  uStack_96 = auVar10._2_2_;
  uStack_94 = auVar10._4_2_;
  uStack_92 = auVar10._6_2_;
  uStack_90 = auVar10._8_2_;
  uStack_8e = auVar10._10_2_;
  uStack_8c = auVar10._12_2_;
  uStack_8a = auVar10._14_2_;
  uVar9 = uVar9 + local_98 * 0xff + 0x80;
  uVar8 = sVar11 + uStack_96 * 0xc5 + 0x80;
  uVar13 = sVar14 + uStack_94 * 0x92 + 0x80;
  uVar16 = sVar17 + uStack_92 * 0x69 + 0x80;
  uVar19 = sVar20 + uStack_90 * 0x49 + 0x80;
  uVar22 = sVar23 + uStack_8e * 0x32 + 0x80;
  uVar25 = sVar26 + uStack_8c * 0x25 + 0x80;
  uVar28 = sVar29 + uStack_8a * 0x20 + 0x80;
  uVar7 = uVar9 >> 8;
  uVar12 = uVar8 >> 8;
  uVar15 = uVar13 >> 8;
  uVar18 = uVar16 >> 8;
  uVar21 = uVar19 >> 8;
  uVar24 = uVar22 >> 8;
  uVar27 = uVar25 >> 8;
  uVar30 = uVar28 >> 8;
  *(ulong *)((long)puVar6 + in_RSI) =
       CONCAT17((uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar30),
                CONCAT16((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar27),
                         CONCAT15((uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar22 >> 8) -
                                  (0xff < uVar24),
                                  CONCAT14((uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar19 >> 8) -
                                           (0xff < uVar21),
                                           CONCAT13((uVar18 != 0) * (uVar18 < 0x100) *
                                                    (char)(uVar16 >> 8) - (0xff < uVar18),
                                                    CONCAT12((uVar15 != 0) * (uVar15 < 0x100) *
                                                             (char)(uVar13 >> 8) - (0xff < uVar15),
                                                             CONCAT11((uVar12 != 0) *
                                                                      (uVar12 < 0x100) *
                                                                      (char)(uVar8 >> 8) -
                                                                      (0xff < uVar12),
                                                                      (uVar7 != 0) * (uVar7 < 0x100)
                                                                      * (char)(uVar9 >> 8) -
                                                                      (0xff < uVar7))))))));
  return;
}

Assistant:

void aom_smooth_h_predictor_8x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i left = cvtepu8_epi16(Load4(left_column));
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_select = _mm_set1_epi32(0x01000100);
  __m128i left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  left_y = _mm_shuffle_epi8(left, y_select);
  write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                &round);
}